

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

MutCommonExpr __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExpr
          (BasicProblem<mp::BasicProblemParams<int>_> *this,NumericExpr expr)

{
  value_type *in_RDI;
  MutCommonExpr MVar1;
  size_t num_exprs;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_ffffffffffffff28;
  vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *in_stack_ffffffffffffff30;
  vector<int,_std::allocator<int>_> *this_00;
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  *this_01;
  undefined1 local_10 [12];
  
  this_01 = (vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             *)(in_RDI + 0x56);
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::size
            ((vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_> *)this_01);
  LinearExpr::LinearExpr((LinearExpr *)0x126dcc);
  std::vector<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>::push_back
            (in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
  LinearExpr::~LinearExpr((LinearExpr *)0x126de7);
  std::
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::push_back(this_01,in_RDI);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x5c);
  CommonExprPosDflt();
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,(value_type_conflict3 *)in_stack_ffffffffffffff28);
  MutCommonExpr::MutCommonExpr((MutCommonExpr *)this_00,in_stack_ffffffffffffff28,0);
  MVar1.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  MVar1.
  super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._0_12_ = local_10;
  return (MutCommonExpr)
         MVar1.
         super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
         .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>;
}

Assistant:

MutCommonExpr AddCommonExpr(NumericExpr expr) {
    std::size_t num_exprs = linear_exprs_.size();
    MP_ASSERT(num_exprs < MP_MAX_PROBLEM_ITEMS, "too many expressions");
    linear_exprs_.push_back(LinearExpr());
    nonlinear_exprs_.push_back(expr);
    common_expr_positions_.push_back(CommonExprPosDflt());
    return MutCommonExpr(this, static_cast<int>(num_exprs));
  }